

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O0

void __thiscall
PSVIWriterHandlers::processFacets
          (PSVIWriterHandlers *this,XSFacetList *facets,XSMultiValueFacetList *multiFacets)

{
  bool bVar1;
  FACET FVar2;
  XMLSize_t XVar3;
  XSFacet *this_00;
  XMLCh *pXVar4;
  XSAnnotation *annotation;
  XSMultiValueFacet *this_01;
  BaseRefVectorOf<char16_t> *this_02;
  char16_t *value;
  XSAnnotationList *annotations;
  uint local_4c;
  uint i;
  StringList *values;
  XSMultiValueFacet *multiFacet;
  uint multiFacetCount;
  XSFacet *facet;
  uint facetCount;
  XSMultiValueFacetList *multiFacets_local;
  XSFacetList *facets_local;
  PSVIWriterHandlers *this_local;
  
  if ((facets == (XSFacetList *)0x0) && (multiFacets == (XSMultiValueFacetList *)0x0)) {
    sendElementEmpty(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgFacets);
  }
  else {
    sendIndentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgFacets);
    if (facets != (XSFacetList *)0x0) {
      for (facet._4_4_ = 0;
          XVar3 = xercesc_4_0::BaseRefVectorOf<xercesc_4_0::XSFacet>::size
                            ((BaseRefVectorOf<xercesc_4_0::XSFacet> *)facets), facet._4_4_ < XVar3;
          facet._4_4_ = facet._4_4_ + 1) {
        this_00 = xercesc_4_0::BaseRefVectorOf<xercesc_4_0::XSFacet>::elementAt
                            ((BaseRefVectorOf<xercesc_4_0::XSFacet> *)facets,(ulong)facet._4_4_);
        FVar2 = xercesc_4_0::XSFacet::getFacetKind(this_00);
        pXVar4 = translateFacet(this,FVar2);
        sendIndentedElement(this,pXVar4);
        pXVar4 = xercesc_4_0::XSFacet::getLexicalFacetValue(this_00);
        sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgValue,pXVar4);
        bVar1 = xercesc_4_0::XSFacet::isFixed(this_00);
        pXVar4 = translateBool(this,bVar1);
        sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgFacetFixed,pXVar4);
        annotation = xercesc_4_0::XSFacet::getAnnotation(this_00);
        processAnnotation(this,annotation);
        FVar2 = xercesc_4_0::XSFacet::getFacetKind(this_00);
        pXVar4 = translateFacet(this,FVar2);
        sendUnindentedElement(this,pXVar4);
      }
    }
    if (multiFacets != (XSMultiValueFacetList *)0x0) {
      for (multiFacet._4_4_ = 0;
          XVar3 = xercesc_4_0::BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet>::size
                            ((BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet> *)multiFacets),
          multiFacet._4_4_ < XVar3; multiFacet._4_4_ = multiFacet._4_4_ + 1) {
        this_01 = xercesc_4_0::BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet>::elementAt
                            ((BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet> *)multiFacets,
                             (ulong)multiFacet._4_4_);
        FVar2 = xercesc_4_0::XSMultiValueFacet::getFacetKind(this_01);
        pXVar4 = translateFacet(this,FVar2);
        sendIndentedElement(this,pXVar4);
        this_02 = &xercesc_4_0::XSMultiValueFacet::getLexicalFacetValues(this_01)->
                   super_BaseRefVectorOf<char16_t>;
        for (local_4c = 0; XVar3 = xercesc_4_0::BaseRefVectorOf<char16_t>::size(this_02),
            local_4c < XVar3; local_4c = local_4c + 1) {
          value = xercesc_4_0::BaseRefVectorOf<char16_t>::elementAt(this_02,(ulong)local_4c);
          sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgValue,value);
        }
        bVar1 = xercesc_4_0::XSMultiValueFacet::isFixed(this_01);
        pXVar4 = translateBool(this,bVar1);
        sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgFacetFixed,pXVar4);
        annotations = xercesc_4_0::XSMultiValueFacet::getAnnotations(this_01);
        processAnnotations(this,annotations);
        FVar2 = xercesc_4_0::XSMultiValueFacet::getFacetKind(this_01);
        pXVar4 = translateFacet(this,FVar2);
        sendUnindentedElement(this,pXVar4);
      }
    }
    sendUnindentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgFacets);
  }
  return;
}

Assistant:

void PSVIWriterHandlers::processFacets(XSFacetList* facets, XSMultiValueFacetList* multiFacets) {
	if (facets == NULL && multiFacets == NULL) {
		sendElementEmpty(PSVIUni::fgFacets);
	} else {
		sendIndentedElement(PSVIUni::fgFacets);
		if (facets != NULL) {
			for (unsigned int facetCount = 0; facetCount < facets->size(); facetCount++) {
				XSFacet* facet = facets->elementAt(facetCount);
				sendIndentedElement(translateFacet(facet->getFacetKind()));
				sendElementValue(PSVIUni::fgValue, facet->getLexicalFacetValue());
				sendElementValue(PSVIUni::fgFacetFixed, translateBool(facet->isFixed()));
				processAnnotation(facet->getAnnotation());
				sendUnindentedElement(translateFacet(facet->getFacetKind()));
			}
		}
		if (multiFacets != NULL) {
			for (unsigned int multiFacetCount = 0; multiFacetCount < multiFacets->size(); multiFacetCount++) {
				XSMultiValueFacet* multiFacet = multiFacets->elementAt(multiFacetCount);
				sendIndentedElement(translateFacet(multiFacet->getFacetKind()));
				StringList* values = multiFacet->getLexicalFacetValues();
				for (unsigned int i=0; i < values->size(); i++) {
					sendElementValue(PSVIUni::fgValue, values->elementAt(i));
				}
				sendElementValue(PSVIUni::fgFacetFixed, translateBool(multiFacet->isFixed()));
				processAnnotations(multiFacet->getAnnotations());
				sendUnindentedElement(translateFacet(multiFacet->getFacetKind()));
			}
		}
		sendUnindentedElement(PSVIUni::fgFacets);
	}
}